

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_handle_lifetime.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZESHandleLifetimeValidation::zesVFManagementGetVFPropertiesExpPrologue
          (ZESHandleLifetimeValidation *this,zes_vf_handle_t hVFhandle,
          zes_vf_exp_properties_t *pProperties)

{
  bool bVar1;
  pointer this_00;
  zes_vf_exp_properties_t *pProperties_local;
  zes_vf_handle_t hVFhandle_local;
  ZESHandleLifetimeValidation *this_local;
  
  this_00 = std::
            unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
            ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                          *)(context + 0xd48));
  bVar1 = HandleLifetimeValidation::isHandleValid<_zes_vf_handle_t*>(this_00,hVFhandle);
  if (bVar1) {
    this_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZESHandleLifetimeValidation::zesVFManagementGetVFPropertiesExpPrologue(
        zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the VF component.
        zes_vf_exp_properties_t* pProperties            ///< [in,out] Will contain VF properties.
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hVFhandle )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }